

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O0

void Hop_ObjDelete(Hop_Man_t *p,Hop_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  Hop_Obj_t *pObj_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,0xbc,"void Hop_ObjDelete(Hop_Man_t *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsTerm(pObj);
  if (iVar1 == 0) {
    iVar1 = Hop_ObjRefs(pObj);
    if (iVar1 == 0) {
      uVar2 = *(uint *)&pObj->field_0x20 & 7;
      p->nObjs[uVar2] = p->nObjs[uVar2] + -1;
      p->nDeleted = p->nDeleted + 1;
      Hop_ObjDisconnect(p,pObj);
      iVar1 = Hop_ObjIsPi(pObj);
      if (iVar1 != 0) {
        Vec_PtrRemove(p->vPis,pObj);
      }
      Hop_ManRecycleMemory(p,pObj);
      return;
    }
    __assert_fail("Hop_ObjRefs(pObj) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                  ,0xbe,"void Hop_ObjDelete(Hop_Man_t *, Hop_Obj_t *)");
  }
  __assert_fail("!Hop_ObjIsTerm(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                ,0xbd,"void Hop_ObjDelete(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

void Hop_ObjDelete( Hop_Man_t * p, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    assert( !Hop_ObjIsTerm(pObj) );
    assert( Hop_ObjRefs(pObj) == 0 );
    // update node counters of the manager
    p->nObjs[pObj->Type]--;
    p->nDeleted++;
    // remove connections
    Hop_ObjDisconnect( p, pObj );
    // remove PIs/POs from the arrays
    if ( Hop_ObjIsPi(pObj) )
        Vec_PtrRemove( p->vPis, pObj );
    // free the node
    Hop_ManRecycleMemory( p, pObj );
}